

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O3

int Ga2_ManMarkup(Gia_Man_t *p,int N,int fSimple)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *vLeaves;
  int *piVar4;
  long lVar5;
  Vec_Int_t *pVVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  Gia_Obj_t *pGVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  
  vLeaves = (Vec_Int_t *)malloc(0x10);
  vLeaves->nCap = 100;
  vLeaves->nSize = 0;
  piVar4 = (int *)malloc(400);
  vLeaves->pArray = piVar4;
  if (fSimple == 0) {
    if (0 < p->nObjs) {
      pGVar11 = p->pObjs;
      if (pGVar11 != (Gia_Obj_t *)0x0) {
        lVar5 = 0;
        do {
          pGVar11->Value = 0;
          uVar13 = *(ulong *)pGVar11;
          if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
            pGVar11[-(uVar13 & 0x1fffffff)].Value = pGVar11[-(uVar13 & 0x1fffffff)].Value + 1;
            pGVar11[-(ulong)((uint)(uVar13 >> 0x20) & 0x1fffffff)].Value =
                 pGVar11[-(ulong)((uint)(uVar13 >> 0x20) & 0x1fffffff)].Value + 1;
            iVar15 = Gia_ObjIsMuxType(pGVar11);
            if (iVar15 != 0) {
              uVar13 = *(ulong *)pGVar11;
              pGVar3 = pGVar11 + -(uVar13 & 0x1fffffff);
              uVar14 = *(ulong *)pGVar3;
              pGVar3[-(uVar14 & 0x1fffffff)].Value = pGVar3[-(uVar14 & 0x1fffffff)].Value + 1;
              pGVar3[-(uVar14 >> 0x20 & 0x1fffffff)].Value =
                   pGVar3[-(uVar14 >> 0x20 & 0x1fffffff)].Value + 1;
              pGVar11 = pGVar11 + -(uVar13 >> 0x20 & 0x1fffffff);
              uVar13 = *(ulong *)pGVar11;
              pGVar11[-(uVar13 & 0x1fffffff)].Value = pGVar11[-(uVar13 & 0x1fffffff)].Value + 1;
              pGVar11[-(uVar13 >> 0x20 & 0x1fffffff)].Value =
                   pGVar11[-(uVar13 >> 0x20 & 0x1fffffff)].Value + 1;
            }
          }
          lVar5 = lVar5 + 1;
        } while ((lVar5 < p->nObjs) && (pGVar11 = p->pObjs + lVar5, p->pObjs != (Gia_Obj_t *)0x0));
        if (p->nObjs < 1) goto LAB_005fd3f6;
      }
      pGVar11 = p->pObjs;
      if (pGVar11 != (Gia_Obj_t *)0x0) {
        lVar5 = 0;
        do {
          uVar13 = *(ulong *)pGVar11;
          *(ulong *)pGVar11 = uVar13 & 0x7fffffffffffffff;
          uVar14 = uVar13 & 0x1fffffff;
          if (uVar14 == 0x1fffffff || (int)uVar13 < 0) {
            if (-1 < (int)uVar13 || (int)uVar14 == 0x1fffffff) {
              uVar14 = uVar13 | 0x8000000000000000;
              goto LAB_005fd33f;
            }
            *(ulong *)(pGVar11 + -uVar14) = *(ulong *)(pGVar11 + -uVar14) | 0x8000000000000000;
          }
          else {
            uVar14 = 0;
            if (1 < pGVar11->Value) {
              uVar14 = 0x8000000000000000;
            }
            uVar14 = uVar14 | uVar13 & 0x7fffffffffffffff;
LAB_005fd33f:
            *(ulong *)pGVar11 = uVar14;
          }
          lVar5 = lVar5 + 1;
        } while ((lVar5 < p->nObjs) && (pGVar11 = p->pObjs + lVar5, p->pObjs != (Gia_Obj_t *)0x0));
        if (p->nObjs < 1) goto LAB_005fd3f6;
      }
      lVar5 = 0;
      lVar8 = 0;
      do {
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar11 = (Gia_Obj_t *)(&p->pObjs->field_0x0 + lVar5);
        if ((*(ulong *)pGVar11 & 0x8000000080000000) == 0x8000000000000000 &&
            (~(uint)*(ulong *)pGVar11 & 0x1fffffff) != 0) {
          vLeaves->nSize = 0;
          Ga2_ManCollectLeaves_rec(p,pGVar11,vLeaves,1);
          if (N < vLeaves->nSize) {
            Ga2_ManBreakTree_rec(p,pGVar11,1,N);
          }
        }
        lVar8 = lVar8 + 1;
        lVar5 = lVar5 + 0xc;
      } while (lVar8 < p->nObjs);
    }
  }
  else if (0 < p->nObjs) {
    lVar5 = 0;
    lVar8 = 0;
    do {
      pGVar11 = p->pObjs;
      if (pGVar11 == (Gia_Obj_t *)0x0) break;
      uVar7 = (uint)*(ulong *)(&pGVar11->field_0x0 + lVar5);
      uVar13 = 0x8000000000000000;
      if ((~uVar7 & 0x1fffffff) != 0) {
        uVar13 = 0;
      }
      if (-1 < (int)uVar7) {
        uVar13 = 0x8000000000000000;
      }
      *(ulong *)(&pGVar11->field_0x0 + lVar5) =
           *(ulong *)(&pGVar11->field_0x0 + lVar5) & 0x7fffffffffffffff | uVar13;
      lVar8 = lVar8 + 1;
      lVar5 = lVar5 + 0xc;
    } while (lVar8 < p->nObjs);
  }
LAB_005fd3f6:
  pVVar6 = p->vMapping;
  if (pVVar6 != (Vec_Int_t *)0x0) {
    if (pVVar6->pArray != (int *)0x0) {
      free(pVVar6->pArray);
      p->vMapping->pArray = (int *)0x0;
      pVVar6 = p->vMapping;
      if (pVVar6 == (Vec_Int_t *)0x0) goto LAB_005fd43e;
    }
    free(pVVar6);
    p->vMapping = (Vec_Int_t *)0x0;
  }
LAB_005fd43e:
  uVar7 = p->nObjs;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  uVar12 = 0x10;
  if (0xe < uVar7 - 1) {
    uVar12 = uVar7;
  }
  pVVar6->nCap = uVar12;
  if (uVar12 == 0) {
    pVVar6->pArray = (int *)0x0;
    pVVar6->nSize = uVar7;
  }
  else {
    piVar4 = (int *)malloc((long)(int)uVar12 << 2);
    pVVar6->pArray = piVar4;
    pVVar6->nSize = uVar7;
    if (piVar4 != (int *)0x0) {
      memset(piVar4,0,(long)(int)uVar7 << 2);
    }
  }
  p->vMapping = pVVar6;
  iVar15 = p->nRegs;
  if (0 < iVar15) {
    iVar9 = 0;
LAB_005fd4ba:
    iVar1 = p->vCis->nSize;
    uVar7 = iVar9 + (iVar1 - iVar15);
    if (((int)uVar7 < 0) || (iVar1 <= (int)uVar7)) {
LAB_005fd84d:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar2 = p->vCis->pArray[uVar7];
    lVar5 = (long)iVar2;
    if ((lVar5 < 0) || (uVar7 = p->nObjs, (int)uVar7 <= iVar2)) {
LAB_005fd80f:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar11 = p->pObjs;
    if (pGVar11 == (Gia_Obj_t *)0x0) goto LAB_005fd669;
    lVar8 = *(long *)(pGVar11 + lVar5);
    if (((~(uint)lVar8 & 0x9fffffff) != 0) ||
       (uVar12 = (uint)((ulong)lVar8 >> 0x20) & 0x1fffffff, (int)uVar12 < iVar1 - iVar15)) {
      __assert_fail("Gia_ObjIsRo(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar15 = p->vCos->nSize;
    uVar12 = (iVar15 - iVar1) + uVar12;
    if (((int)uVar12 < 0) || (iVar15 <= (int)uVar12)) goto LAB_005fd84d;
    uVar12 = p->vCos->pArray[uVar12];
    if (((long)(int)uVar12 < 0) || (uVar7 <= uVar12)) goto LAB_005fd80f;
    if (-1 < lVar8) {
      __assert_fail("pObj->fPhase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                    ,0x12f,"int Ga2_ManMarkup(Gia_Man_t *, int, int)");
    }
    pGVar11 = pGVar11 + (int)uVar12;
    if (-1 < *(long *)(pGVar11 + -(ulong)((uint)*(undefined8 *)pGVar11 & 0x1fffffff))) {
      __assert_fail("Gia_ObjFanin0(pObjRi)->fPhase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                    ,0x130,"int Ga2_ManMarkup(Gia_Man_t *, int, int)");
    }
    pVVar6 = p->vMapping;
    if (pVVar6->nSize <= iVar2) goto LAB_005fd8aa;
    pVVar6->pArray[lVar5] = pVVar6->nSize;
    Vec_IntPush(pVVar6,1);
    pGVar3 = p->pObjs;
    if ((pGVar11 < pGVar3) || (pGVar3 + p->nObjs <= pGVar11)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    Vec_IntPush(p->vMapping,
                (int)((ulong)((long)pGVar11 - (long)pGVar3) >> 2) * -0x55555555 -
                (*(uint *)pGVar11 & 0x1fffffff));
    iVar15 = 0x55555555;
    if ((*(uint *)pGVar11 >> 0x1d & 1) == 0) {
      iVar15 = -0x55555556;
    }
    Vec_IntPush(p->vMapping,iVar15);
    Vec_IntPush(p->vMapping,-1);
    iVar9 = iVar9 + 1;
    iVar15 = p->nRegs;
    if (iVar9 < iVar15) goto LAB_005fd4ba;
    uVar7 = p->nObjs;
  }
  if (0 < (int)uVar7) {
LAB_005fd669:
    lVar5 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar11 = p->pObjs + lVar5;
      if ((*(ulong *)pGVar11 & 0x8000000080000000) == 0x8000000000000000 &&
          (~(uint)*(ulong *)pGVar11 & 0x1fffffff) != 0) {
        vLeaves->nSize = 0;
        Ga2_ManCollectLeaves_rec(p,pGVar11,vLeaves,1);
        uVar7 = vLeaves->nSize;
        if (N < (int)uVar7) {
          __assert_fail("Vec_IntSize(vLeaves) <= N",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                        ,0x13f,"int Ga2_ManMarkup(Gia_Man_t *, int, int)");
        }
        pVVar6 = p->vMapping;
        if (pVVar6->nSize <= lVar5) {
LAB_005fd8aa:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pVVar6->pArray[lVar5] = pVVar6->nSize;
        Vec_IntPush(pVVar6,uVar7);
        if (0 < (int)uVar7) {
          piVar4 = vLeaves->pArray;
          lVar8 = 0;
          do {
            iVar9 = *(int *)((long)piVar4 + lVar8);
            lVar10 = (long)iVar9;
            Vec_IntPush(p->vMapping,iVar9);
            if ((lVar10 < 0) || (p->nObjs <= iVar9)) goto LAB_005fd80f;
            pGVar3 = p->pObjs;
            pGVar3[lVar10].Value = *(uint *)((long)Ga2_ManComputeTruth::uTruth5 + lVar8);
            if (-1 < *(long *)(pGVar3 + lVar10)) {
              __assert_fail("Gia_ManObj(p, Leaf)->fPhase",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                            ,0x147,"int Ga2_ManMarkup(Gia_Man_t *, int, int)");
            }
            lVar8 = lVar8 + 4;
          } while ((ulong)uVar7 << 2 != lVar8);
        }
        pVVar6 = p->vMapping;
        uVar7 = Ga2_ObjComputeTruth_rec(p,pGVar11,1);
        Vec_IntPush(pVVar6,uVar7);
        Vec_IntPush(p->vMapping,-1);
        iVar15 = iVar15 + 1;
        uVar7 = p->nObjs;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (int)uVar7);
  }
  if (vLeaves->pArray != (int *)0x0) {
    free(vLeaves->pArray);
  }
  free(vLeaves);
  Gia_ManCleanValue(p);
  return iVar15;
}

Assistant:

int Ga2_ManMarkup( Gia_Man_t * p, int N, int fSimple )
{
    static unsigned uTruth5[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
//    abctime clk = Abc_Clock();
    Vec_Int_t * vLeaves;
    Gia_Obj_t * pObj;
    int i, k, Leaf, CountMarks;

    vLeaves = Vec_IntAlloc( 100 );

    if ( fSimple )
    {
        Gia_ManForEachObj( p, pObj, i )
            pObj->fPhase = !Gia_ObjIsCo(pObj);
    }
    else
    {
        // label nodes with multiple fanouts and inputs MUXes
        Gia_ManForEachObj( p, pObj, i )
        {
            pObj->Value = 0;
            if ( !Gia_ObjIsAnd(pObj) )
                continue;
            Gia_ObjFanin0(pObj)->Value++;
            Gia_ObjFanin1(pObj)->Value++;
            if ( !Gia_ObjIsMuxType(pObj) )
                continue;
            Gia_ObjFanin0(Gia_ObjFanin0(pObj))->Value++;
            Gia_ObjFanin1(Gia_ObjFanin0(pObj))->Value++;
            Gia_ObjFanin0(Gia_ObjFanin1(pObj))->Value++;
            Gia_ObjFanin1(Gia_ObjFanin1(pObj))->Value++;
        }
        Gia_ManForEachObj( p, pObj, i )
        {
            pObj->fPhase = 0;
            if ( Gia_ObjIsAnd(pObj) )
                pObj->fPhase = (pObj->Value > 1);
            else if ( Gia_ObjIsCo(pObj) )
                Gia_ObjFanin0(pObj)->fPhase = 1;
            else 
                pObj->fPhase = 1;
        } 
        // add marks when needed
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( !pObj->fPhase )
                continue;
            Vec_IntClear( vLeaves );
            Ga2_ManCollectLeaves_rec( p, pObj, vLeaves, 1 );
            if ( Vec_IntSize(vLeaves) > N )
                Ga2_ManBreakTree_rec( p, pObj, 1, N );
        }
    }

    // verify that the tree is split correctly
    Vec_IntFreeP( &p->vMapping );
    p->vMapping = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachRo( p, pObj, i )
    {
        Gia_Obj_t * pObjRi = Gia_ObjRoToRi(p, pObj);
        assert( pObj->fPhase );
        assert( Gia_ObjFanin0(pObjRi)->fPhase );
        // create map
        Vec_IntWriteEntry( p->vMapping, Gia_ObjId(p, pObj), Vec_IntSize(p->vMapping) );
        Vec_IntPush( p->vMapping, 1 );
        Vec_IntPush( p->vMapping, Gia_ObjFaninId0p(p, pObjRi) );
        Vec_IntPush( p->vMapping, Gia_ObjFaninC0(pObjRi) ? 0x55555555 : 0xAAAAAAAA );
        Vec_IntPush( p->vMapping, -1 );  // placeholder for ref counter
    }
    CountMarks = Gia_ManRegNum(p);
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !pObj->fPhase )
            continue;
        Vec_IntClear( vLeaves );
        Ga2_ManCollectLeaves_rec( p, pObj, vLeaves, 1 );
        assert( Vec_IntSize(vLeaves) <= N );
        // create map
        Vec_IntWriteEntry( p->vMapping, i, Vec_IntSize(p->vMapping) );
        Vec_IntPush( p->vMapping, Vec_IntSize(vLeaves) );
        Vec_IntForEachEntry( vLeaves, Leaf, k )
        {            
            Vec_IntPush( p->vMapping, Leaf );
            Gia_ManObj(p, Leaf)->Value = uTruth5[k];
            assert( Gia_ManObj(p, Leaf)->fPhase );
        }
        Vec_IntPush( p->vMapping,  (int)Ga2_ObjComputeTruth_rec( p, pObj, 1 ) );
        Vec_IntPush( p->vMapping, -1 );  // placeholder for ref counter
        CountMarks++;
    }
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Vec_IntFree( vLeaves );
    Gia_ManCleanValue( p );
    return CountMarks;
}